

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddSymbol
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *name,
          FileDescriptorProto *value)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>_>
  *this_00;
  bool bVar1;
  const_iterator cVar2;
  LogMessage *pLVar3;
  const_iterator __pos;
  size_type extraout_RDX;
  _Rb_tree_header *p_Var4;
  StringPiece name_00;
  LogFinisher local_c9;
  LogMessage local_c8;
  FileDescriptorProto *local_90;
  _Base_ptr local_88;
  StringPiece local_80;
  StringPiece local_70;
  StringPiece local_60;
  StringPiece local_50;
  StringPiece local_40;
  
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_40,name);
  name_00.length_ = extraout_RDX;
  name_00.ptr_ = (char *)local_40.length_;
  bVar1 = anon_unknown_31::ValidateSymbolName((anon_unknown_31 *)local_40.ptr_,name_00);
  if (bVar1) {
    this_00 = &this->by_symbol_;
    cVar2 = (anonymous_namespace)::
            FindLastLessOrEqual<std::map<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>,std::__cxx11::string>
                      (this_00,name);
    p_Var4 = &(this->by_symbol_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar2._M_node == p_Var4) {
      std::__cxx11::string::string((string *)&local_c8,(string *)name);
      local_c8.message_._M_string_length = (size_type)value;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>
      ::
      _M_insert_unique<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>
                  *)this_00,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>
                  *)&local_c8);
    }
    else {
      local_88 = cVar2._M_node + 1;
      local_90 = value;
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                (&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_60,name);
      bVar1 = anon_unknown_31::IsSubSymbol(local_50,local_60);
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_c8,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                   ,0xdc);
        pLVar3 = internal::LogMessage::operator<<(&local_c8,"Symbol name \"");
        pLVar3 = internal::LogMessage::operator<<(pLVar3,name);
        pLVar3 = internal::LogMessage::operator<<(pLVar3,"\" conflicts with the existing symbol \"")
        ;
        pLVar3 = internal::LogMessage::operator<<(pLVar3,(string *)local_88);
        pLVar3 = internal::LogMessage::operator<<(pLVar3,"\".");
        internal::LogFinisher::operator=(&local_c9,pLVar3);
        goto LAB_0038a719;
      }
      __pos._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar2._M_node);
      if ((_Rb_tree_header *)__pos._M_node != p_Var4) {
        stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_70,name);
        stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                  (&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (__pos._M_node + 1));
        bVar1 = anon_unknown_31::IsSubSymbol(local_70,local_80);
        if (bVar1) {
          internal::LogMessage::LogMessage
                    (&local_c8,LOGLEVEL_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                     ,0xeb);
          pLVar3 = internal::LogMessage::operator<<(&local_c8,"Symbol name \"");
          pLVar3 = internal::LogMessage::operator<<(pLVar3,name);
          pLVar3 = internal::LogMessage::operator<<
                             (pLVar3,"\" conflicts with the existing symbol \"");
          pLVar3 = internal::LogMessage::operator<<(pLVar3,(string *)(__pos._M_node + 1));
          pLVar3 = internal::LogMessage::operator<<(pLVar3,"\".");
          internal::LogFinisher::operator=(&local_c9,pLVar3);
          goto LAB_0038a719;
        }
      }
      std::__cxx11::string::string((string *)&local_c8,(string *)name);
      local_c8.message_._M_string_length = (size_type)local_90;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>
      ::
      _M_insert_unique_<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>
                  *)this_00,__pos,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>
                  *)&local_c8);
    }
    std::__cxx11::string::~string((string *)&local_c8);
    bVar1 = true;
  }
  else {
    internal::LogMessage::LogMessage
              (&local_c8,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0xcc);
    pLVar3 = internal::LogMessage::operator<<(&local_c8,"Invalid symbol name: ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,name);
    internal::LogFinisher::operator=(&local_c9,pLVar3);
LAB_0038a719:
    internal::LogMessage::~LogMessage(&local_c8);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddSymbol(
    const std::string& name, Value value) {
  // We need to make sure not to violate our map invariant.

  // If the symbol name is invalid it could break our lookup algorithm (which
  // relies on the fact that '.' sorts before all other characters that are
  // valid in symbol names).
  if (!ValidateSymbolName(name)) {
    GOOGLE_LOG(ERROR) << "Invalid symbol name: " << name;
    return false;
  }

  // Try to look up the symbol to make sure a super-symbol doesn't already
  // exist.
  auto iter = FindLastLessOrEqual(&by_symbol_, name);

  if (iter == by_symbol_.end()) {
    // Apparently the map is currently empty.  Just insert and be done with it.
    by_symbol_.insert(
        typename std::map<std::string, Value>::value_type(name, value));
    return true;
  }

  if (IsSubSymbol(iter->first, name)) {
    GOOGLE_LOG(ERROR) << "Symbol name \"" << name
               << "\" conflicts with the existing "
                  "symbol \""
               << iter->first << "\".";
    return false;
  }

  // OK, that worked.  Now we have to make sure that no symbol in the map is
  // a sub-symbol of the one we are inserting.  The only symbol which could
  // be so is the first symbol that is greater than the new symbol.  Since
  // |iter| points at the last symbol that is less than or equal, we just have
  // to increment it.
  ++iter;

  if (iter != by_symbol_.end() && IsSubSymbol(name, iter->first)) {
    GOOGLE_LOG(ERROR) << "Symbol name \"" << name
               << "\" conflicts with the existing "
                  "symbol \""
               << iter->first << "\".";
    return false;
  }

  // OK, no conflicts.

  // Insert the new symbol using the iterator as a hint, the new entry will
  // appear immediately before the one the iterator is pointing at.
  by_symbol_.insert(
      iter, typename std::map<std::string, Value>::value_type(name, value));

  return true;
}